

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<void(S::*const&)()>::operator==
          (result *__return_storage_ptr__,expression_lhs<void(S::*const&)()> *this,
          offset_in_S_to_subr *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  offset_in_S_to_subr oVar2;
  offset_in_S_to_subr oVar3;
  offset_in_S_to_subr oVar4;
  offset_in_S_to_subr oVar5;
  size_type sVar6;
  result *prVar7;
  offset_in_S_to_subr *in_R8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 uStack_c8;
  string local_c0;
  result *local_a0;
  char *local_98;
  size_type local_90;
  char local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  oVar2 = *(offset_in_S_to_subr *)this_00;
  oVar3 = *(offset_in_S_to_subr *)(this_00 + 8);
  oVar4 = *rhs;
  oVar5 = rhs[1];
  local_e0 = local_d0;
  local_a0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"==","");
  if (local_e0 == local_d0) {
    uStack_60 = uStack_c8;
    local_78 = local_68;
  }
  else {
    local_78 = local_e0;
  }
  local_70 = local_d8;
  local_d8 = 0;
  local_d0[0] = 0;
  local_e0 = local_d0;
  to_string<void(S::*)(),void(S::*)()>
            (&local_c0,this_00,(offset_in_S_to_subr *)&local_78,(string *)rhs,in_R8);
  sVar6 = local_c0._M_string_length;
  local_58 = oVar2 == oVar4 && (oVar2 == 0 || oVar3 == oVar5);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    uStack_80 = local_c0.field_2._8_4_;
    uStack_7c = local_c0.field_2._12_4_;
    local_98 = local_88;
  }
  else {
    local_98 = local_c0._M_dataplus._M_p;
  }
  local_90 = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_98 + sVar6);
  prVar7 = local_a0;
  local_a0->passed = local_58;
  (local_a0->decomposition)._M_dataplus._M_p = (pointer)&(local_a0->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return prVar7;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }